

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

_Bool tlb_hit_page_anyprot
                (uc_struct_conflict15 *uc,CPUTLBEntry *tlb_entry,target_ulong_conflict page)

{
  _Bool _Var1;
  target_ulong_conflict tlb_addr;
  _Bool local_1d;
  target_ulong_conflict page_local;
  CPUTLBEntry *tlb_entry_local;
  uc_struct_conflict15 *uc_local;
  
  _Var1 = tlb_hit_page(uc,(tlb_entry->field_0).field_0.addr_read,page);
  local_1d = true;
  if (!_Var1) {
    tlb_addr = tlb_addr_write(tlb_entry);
    _Var1 = tlb_hit_page(uc,tlb_addr,page);
    local_1d = true;
    if (!_Var1) {
      local_1d = tlb_hit_page(uc,(tlb_entry->field_0).field_0.addr_write,page);
    }
  }
  return local_1d;
}

Assistant:

static inline bool tlb_hit_page_anyprot(struct uc_struct *uc, CPUTLBEntry *tlb_entry,
                                        target_ulong page)
{
    return tlb_hit_page(uc, tlb_entry->addr_read, page) ||
           tlb_hit_page(uc, tlb_addr_write(tlb_entry), page) ||
           tlb_hit_page(uc, tlb_entry->addr_code, page);
}